

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

RealLiteral * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RealLiteral,slang::ast::Type_const&,double,slang::SourceRange>
          (BumpAllocator *this,Type *args,double *args_1,SourceRange *args_2)

{
  double dVar1;
  SourceLocation SVar2;
  SourceLocation SVar3;
  RealLiteral *pRVar4;
  
  pRVar4 = (RealLiteral *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RealLiteral *)this->endPtr < pRVar4 + 1) {
    pRVar4 = (RealLiteral *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pRVar4 + 1);
  }
  dVar1 = *args_1;
  SVar2 = args_2->startLoc;
  SVar3 = args_2->endLoc;
  (pRVar4->super_Expression).kind = RealLiteral;
  (pRVar4->super_Expression).type.ptr = args;
  (pRVar4->super_Expression).constant = (ConstantValue *)0x0;
  (pRVar4->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pRVar4->super_Expression).sourceRange.startLoc = SVar2;
  (pRVar4->super_Expression).sourceRange.endLoc = SVar3;
  pRVar4->value = dVar1;
  return pRVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }